

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  uInt uVar2;
  uInt uVar3;
  uInt uVar4;
  Posf *pPVar5;
  Posf *pPVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  Bytef *pBVar14;
  uInt uVar15;
  uInt uVar16;
  bool bVar17;
  
LAB_002d76d4:
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      uVar9 = s->lookahead;
      if (flush == 0 && uVar9 < 0x106) {
        return need_more;
      }
      if (uVar9 == 0) {
        uVar9 = s->strstart;
        uVar11 = 2;
        if (uVar9 < 2) {
          uVar11 = uVar9;
        }
        s->insert = uVar11;
        if (flush == 4) {
          uVar10 = s->block_start;
          if ((long)uVar10 < 0) {
            pBVar14 = (Bytef *)0x0;
          }
          else {
            pBVar14 = s->window + (uVar10 & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)pBVar14,uVar9 - uVar10,1);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->last_lit != 0) {
          uVar10 = s->block_start;
          if ((long)uVar10 < 0) {
            pBVar14 = (Bytef *)0x0;
          }
          else {
            pBVar14 = s->window + (uVar10 & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)pBVar14,uVar9 - uVar10,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      if (2 < uVar9) goto LAB_002d7712;
LAB_002d776b:
      uVar9 = s->match_length;
    }
    else {
LAB_002d7712:
      uVar9 = s->strstart;
      uVar11 = ((uint)s->window[uVar9 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
               s->hash_mask;
      s->ins_h = uVar11;
      pPVar5 = s->head;
      uVar1 = pPVar5[uVar11];
      s->prev[s->w_mask & uVar9] = uVar1;
      pPVar5[uVar11] = (Posf)uVar9;
      uVar11 = (uint)uVar1;
      if ((uVar11 == 0) || (s->w_size - 0x106 < uVar9 - uVar11)) goto LAB_002d776b;
      uVar9 = longest_match(s,uVar11);
      s->match_length = uVar9;
    }
    if (uVar9 < 3) {
      bVar8 = s->window[s->strstart];
      uVar9 = s->last_lit;
      s->d_buf[uVar9] = 0;
      s->last_lit = uVar9 + 1;
      s->l_buf[uVar9] = bVar8;
      s->dyn_ltree[bVar8].fc.freq = s->dyn_ltree[bVar8].fc.freq + 1;
      s->lookahead = s->lookahead - 1;
      uVar9 = s->strstart + 1;
      uVar10 = (ulong)uVar9;
      s->strstart = uVar9;
      if (s->last_lit != s->lit_bufsize - 1) goto LAB_002d76d4;
    }
    else {
      bVar8 = (char)uVar9 - 3;
      iVar12 = s->strstart - s->match_start;
      uVar9 = s->last_lit;
      s->d_buf[uVar9] = (ushf)iVar12;
      s->last_lit = uVar9 + 1;
      s->l_buf[uVar9] = bVar8;
      uVar13 = iVar12 - 1;
      s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq + 1;
      uVar11 = uVar13 & 0xffff;
      uVar9 = (uVar11 >> 7) + 0x100;
      if (uVar11 < 0x100) {
        uVar9 = uVar13;
      }
      s->dyn_dtree[""[uVar9 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar9 & 0xffff]].fc.freq + 1;
      uVar2 = s->last_lit;
      uVar3 = s->lit_bufsize;
      uVar9 = s->match_length;
      uVar11 = s->lookahead - uVar9;
      s->lookahead = uVar11;
      if (uVar11 < 3 || s->max_lazy_match < uVar9) {
        uVar4 = s->strstart;
        uVar11 = uVar4 + uVar9;
        uVar10 = (ulong)uVar11;
        s->strstart = uVar11;
        s->match_length = 0;
        uVar11 = (uint)s->window[uVar10];
        s->ins_h = uVar11;
        s->ins_h = ((uint)s->window[uVar4 + uVar9 + 1] ^ uVar11 << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
      }
      else {
        s->match_length = uVar9 - 1;
        uVar4 = s->hash_shift;
        pBVar14 = s->window;
        uVar11 = s->hash_mask;
        pPVar5 = s->head;
        pPVar6 = s->prev;
        uVar13 = s->w_mask;
        uVar16 = s->ins_h;
        uVar15 = uVar9 - 2;
        uVar10 = (ulong)(s->strstart + 1);
        do {
          uVar9 = (uint)uVar10;
          s->strstart = uVar9;
          uVar16 = ((uint)pBVar14[uVar9 + 2] ^ uVar16 << ((byte)uVar4 & 0x1f)) & uVar11;
          s->ins_h = uVar16;
          pPVar6[uVar13 & uVar9] = pPVar5[uVar16];
          pPVar5[uVar16] = (Posf)uVar10;
          s->match_length = uVar15;
          uVar10 = (ulong)(uVar9 + 1);
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        s->strstart = uVar9 + 1;
      }
      if (uVar2 != uVar3 - 1) goto LAB_002d76d4;
    }
    uVar7 = s->block_start;
    if ((long)uVar7 < 0) {
      pBVar14 = (Bytef *)0x0;
    }
    else {
      pBVar14 = s->window + (uVar7 & 0xffffffff);
    }
    _tr_flush_block(s,(charf *)pBVar14,uVar10 - uVar7,0);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    if (s->strm->avail_out == 0) {
      return need_more;
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head;       /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = NIL;
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            s->match_length = longest_match (s, hash_head);
            /* longest_match() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    INSERT_STRING(s, s->strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;
                s->ins_h = s->window[s->strstart];
                UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < MIN_MATCH-1 ? s->strstart : MIN_MATCH-1;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->last_lit)
        FLUSH_BLOCK(s, 0);
    return block_done;
}